

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardware.cpp
# Opt level: O2

void I_ClosestResolution(int *width,int *height,int bits)

{
  IVideo *pIVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int local_48;
  int theight;
  ulong local_40;
  uint local_38;
  int twidth;
  
  local_40 = 0;
  iVar4 = 0;
  local_48 = 0;
  local_38 = bits;
  do {
    pIVar1 = Video;
    if (iVar4 == 2) {
      return;
    }
    bVar2 = fullscreen.Value;
    if (screen != (DFrameBuffer *)0x0) {
      iVar3 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x21])();
      bVar2 = (byte)iVar3;
    }
    (*pIVar1->_vptr_IVideo[5])(pIVar1,(ulong)local_38,(ulong)bVar2);
    uVar7 = 0xffffffff;
LAB_002f1ecb:
    iVar3 = (*Video->_vptr_IVideo[6])(Video,&twidth,&theight,0);
    if ((char)iVar3 != '\0') {
      iVar3 = twidth - *width;
      if ((iVar3 == 0) && (theight == *height)) {
        return;
      }
      if (iVar4 == 0) break;
      iVar5 = *height;
      goto LAB_002f1f13;
    }
    iVar4 = iVar4 + 1;
    if (uVar7 != 0xffffffff) {
      *width = local_48;
      *height = (int)local_40;
      return;
    }
  } while( true );
  if ((*width <= twidth) && (iVar5 = *height, iVar5 <= theight)) {
LAB_002f1f13:
    uVar6 = (theight - iVar5) * (theight - iVar5) + iVar3 * iVar3;
    local_40 = local_40 & 0xffffffff;
    if (uVar6 < uVar7) {
      local_40 = (ulong)(uint)theight;
      local_48 = twidth;
      uVar7 = uVar6;
    }
  }
  goto LAB_002f1ecb;
}

Assistant:

void I_ClosestResolution (int *width, int *height, int bits)
{
	int twidth, theight;
	int cwidth = 0, cheight = 0;
	int iteration;
	DWORD closest = 4294967295u;

	for (iteration = 0; iteration < 2; iteration++)
	{
		Video->StartModeIterator (bits, screen ? screen->IsFullscreen() : fullscreen);
		while (Video->NextMode (&twidth, &theight, NULL))
		{
			if (twidth == *width && theight == *height)
				return;

			if (iteration == 0 && (twidth < *width || theight < *height))
				continue;

			DWORD dist = (twidth - *width) * (twidth - *width)
				+ (theight - *height) * (theight - *height);

			if (dist < closest)
			{
				closest = dist;
				cwidth = twidth;
				cheight = theight;
			}
		}
		if (closest != 4294967295u)
		{
			*width = cwidth;
			*height = cheight;
			return;
		}
	}
}